

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall asl::Array<const_char_*>::alloc(Array<const_char_*> *this,int m)

{
  int iVar1;
  uint uVar2;
  bad_alloc *this_00;
  Data *pDVar3;
  AtomicCount local_24;
  void *local_20;
  char *p;
  int s;
  int m_local;
  Array<const_char_*> *this_local;
  
  p._4_4_ = m;
  _s = this;
  p._0_4_ = max<int>(m,3);
  local_20 = malloc((long)(int)p * 8 + 0x10);
  iVar1 = (int)p;
  if (local_20 == (void *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this->_a = (char **)((long)local_20 + 0x10);
  pDVar3 = d(this);
  uVar2 = p._4_4_;
  pDVar3->s = iVar1;
  pDVar3 = d(this);
  pDVar3->n = uVar2;
  AtomicCount::AtomicCount(&local_24,1);
  pDVar3 = d(this);
  (pDVar3->rc).n = local_24.n;
  asl_construct<char_const*>((asl *)this->_a,(char **)(ulong)p._4_4_,local_24.n);
  return;
}

Assistant:

void Array<T>::alloc(int m)
{
	int s=max(m, 3);
	char* p = (char*) malloc( s*sizeof(T)+sizeof(Data) );
	if(!p)
		ASL_BAD_ALLOC();
	_a = (T*) ( p + sizeof(Data) );
	ASL_RC_INIT();
	d().s = s;
	d().n = m;
	d().rc=1;
	asl_construct(_a, m);
}